

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::H2V1Convert(jpeg_decoder *this)

{
  byte bVar1;
  uint8 *puVar2;
  long lVar3;
  uint8 *puVar4;
  int iVar5;
  int iVar6;
  uint8 *puVar7;
  int iVar8;
  uint8 *puVar9;
  int j;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  lVar3 = (long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left;
  puVar7 = this->m_pScan_line_0;
  puVar2 = this->m_pSample_buf + lVar3 * 8;
  puVar4 = this->m_pSample_buf + lVar3 * 8 + 0x80;
  for (iVar5 = this->m_max_mcus_per_row; 0 < iVar5; iVar5 = iVar5 + -1) {
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      puVar9 = puVar7;
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        iVar14 = this->m_crr[puVar4[lVar3 + 0x40]];
        uVar11 = (uint)puVar2[lVar3 * 2];
        iVar12 = iVar14 + uVar11;
        iVar6 = 0;
        if (iVar12 < 1) {
          iVar12 = iVar6;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        iVar10 = this->m_cbg[puVar4[lVar3]] + this->m_crg[puVar4[lVar3 + 0x40]] >> 0x10;
        iVar13 = this->m_cbb[puVar4[lVar3]];
        puVar7[lVar3 * 8] = (uint8)iVar12;
        iVar12 = iVar10 + uVar11;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        puVar7[lVar3 * 8 + 1] = (uint8)iVar12;
        iVar12 = uVar11 + iVar13;
        if (iVar12 < 1) {
          iVar12 = iVar6;
        }
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        puVar7[lVar3 * 8 + 2] = (uint8)iVar12;
        puVar7[lVar3 * 8 + 3] = 0xff;
        bVar1 = puVar2[lVar3 * 2 + 1];
        iVar14 = iVar14 + (uint)bVar1;
        if (iVar14 < 1) {
          iVar14 = iVar6;
        }
        if (0xfe < iVar14) {
          iVar14 = 0xff;
        }
        puVar7[lVar3 * 8 + 4] = (uint8)iVar14;
        iVar10 = iVar10 + (uint)bVar1;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        puVar7[lVar3 * 8 + 5] = (uint8)iVar10;
        iVar13 = iVar13 + (uint)bVar1;
        if (0 < iVar13) {
          iVar6 = iVar13;
        }
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        puVar7[lVar3 * 8 + 6] = (uint8)iVar6;
        puVar7[lVar3 * 8 + 7] = 0xff;
        puVar9 = puVar9 + 8;
      }
      puVar2 = puVar2 + 0x40;
      puVar4 = puVar4 + 4;
      puVar7 = puVar9;
    }
    puVar2 = puVar2 + 0x80;
    puVar4 = puVar4 + 0xf8;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1Convert()
{
  int row = m_max_mcu_y_size - m_mcu_lines_left;
  uint8 *d0 = m_pScan_line_0;
  uint8 *y = m_pSample_buf + row * 8;
  uint8 *c = m_pSample_buf + 2*64 + row * 8;

  for (int i = m_max_mcus_per_row; i > 0; i--)
  {
    for (int l = 0; l < 2; l++)
    {
      for (int j = 0; j < 4; j++)
      {
        int cb = c[0];
        int cr = c[64];

        int rc = m_crr[cr];
        int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
        int bc = m_cbb[cb];

        int yy = y[j<<1];
        d0[0] = clamp(yy+rc);
        d0[1] = clamp(yy+gc);
        d0[2] = clamp(yy+bc);
        d0[3] = 255;

        yy = y[(j<<1)+1];
        d0[4] = clamp(yy+rc);
        d0[5] = clamp(yy+gc);
        d0[6] = clamp(yy+bc);
        d0[7] = 255;

        d0 += 8;

        c++;
      }
      y += 64;
    }

    y += 64*4 - 64*2;
    c += 64*4 - 8;
  }
}